

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::FboTestCase::FboTestCase
          (FboTestCase *this,Context *context,char *name,char *description,
          bool useScreenSizedViewport)

{
  int iVar1;
  RenderTarget *pRVar2;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00b41f90;
  (this->super_TestCase).m_context = context;
  sglr::ContextWrapper::ContextWrapper(&this->super_ContextWrapper);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_00b4cf00;
  if (useScreenSizedViewport) {
    pRVar2 = Context::getRenderTarget(context);
    this->m_viewportWidth = pRVar2->m_width;
    iVar1 = 0x80;
    if (useScreenSizedViewport) {
      pRVar2 = Context::getRenderTarget(context);
      iVar1 = pRVar2->m_height;
    }
  }
  else {
    this->m_viewportWidth = 0x80;
    iVar1 = 0x80;
  }
  this->m_viewportHeight = iVar1;
  return;
}

Assistant:

FboTestCase::FboTestCase (Context& context, const char* name, const char* description, bool useScreenSizedViewport)
	: TestCase			(context, name, description)
	, m_viewportWidth	(useScreenSizedViewport ? context.getRenderTarget().getWidth() : 128)
	, m_viewportHeight	(useScreenSizedViewport ? context.getRenderTarget().getHeight() : 128)
{
}